

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationBounds_Test::TestBody
          (TimeUtilTest_DurationBounds_Test *this)

{
  DeathTest *pDVar1;
  DeathTest *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  StringLike<const_char_*> *regex_05;
  StringLike<const_char_*> *regex_06;
  StringLike<const_char_*> *regex_07;
  StringLike<const_char_*> *regex_08;
  StringLike<const_char_*> *regex_09;
  StringLike<const_char_*> *regex_10;
  StringLike<const_char_*> *regex_11;
  StringLike<const_char_*> *regex_12;
  DeathTest *gtest_dt;
  Duration underflow;
  Duration overflow;
  Duration underflow_nanos;
  Duration overflow_nanos;
  DeathTest *local_340;
  AssertHelper local_338;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_330;
  Duration local_310;
  Duration local_2e8;
  Duration local_2c0;
  Duration local_298;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_270;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_258;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_240;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_228;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_210;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_198;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_180;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_168;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_150;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_138;
  Duration local_120;
  Duration local_f8;
  Duration local_d0;
  Duration local_a8;
  Duration local_80;
  Duration local_58;
  
  Duration::Duration(&local_2e8,(Arena *)0x0);
  local_2e8.field_0._impl_.seconds_ = 0x4979cb9e01;
  local_2e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2e8.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  Duration::Duration(&local_310,(Arena *)0x0);
  local_310.field_0._impl_.seconds_ = -0x4979cb9e01;
  local_310.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_310.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  Duration::Duration(&local_298,(Arena *)0x0);
  local_298.field_0._impl_.nanos_ = 1000000000;
  local_298.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_298.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  Duration::Duration(&local_2c0,(Arena *)0x0);
  local_2c0.field_0._impl_.nanos_ = -1000000000;
  local_2c0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_2c0.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1282841;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_138,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(overflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_138,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ad,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_138);
    pDVar1 = local_340;
    bVar3 = true;
    if (bVar4) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcd603;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::SecondsToDuration(&local_58,local_2e8.field_0._impl_.seconds_);
              Duration::~Duration(&local_58);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcd603:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_00bcd616;
      }
      bVar3 = false;
    }
LAB_00bcd616:
    if (bVar3) goto LAB_00bcd61a;
  }
  else {
LAB_00bcd61a:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ad,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1282841;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_150,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(underflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_150,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1af,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_150);
    pDVar1 = local_340;
    bVar3 = true;
    if (bVar4) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcd78b;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::SecondsToDuration(&local_80,local_310.field_0._impl_.seconds_);
              Duration::~Duration(&local_80);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcd78b:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_00bcd79e;
      }
      bVar3 = false;
    }
LAB_00bcd79e:
    if (bVar3) goto LAB_00bcd7a2;
  }
  else {
LAB_00bcd7a2:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1af,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x12828c6;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_168,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_168,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b2,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_168);
    pDVar1 = local_340;
    iVar5 = 6;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcd93c;
          iVar5 = 6;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::MinutesToDuration(&local_a8,local_2e8.field_0._impl_.seconds_ / 0x3c + 1);
              Duration::~Duration(&local_a8);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcd93c:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bcd94f;
      }
      iVar5 = 0;
    }
LAB_00bcd94f:
    if (iVar5 != 0) goto LAB_00bcd953;
  }
  else {
LAB_00bcd953:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x12828c6;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_180,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_180,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b5,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_180);
    pDVar1 = local_340;
    bVar3 = true;
    if (bVar4) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcdaed;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::MinutesToDuration(&local_d0,local_310.field_0._impl_.seconds_ / 0x3c + -1);
              Duration::~Duration(&local_d0);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcdaed:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_00bcdb00;
      }
      bVar3 = false;
    }
LAB_00bcdb00:
    if (bVar3) goto LAB_00bcdb04;
  }
  else {
LAB_00bcdb04:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1282952;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_198,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_198,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b8,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_198);
    pDVar1 = local_340;
    iVar5 = 10;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcdc9e;
          iVar5 = 10;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::HoursToDuration(&local_f8,local_2e8.field_0._impl_.seconds_ / 0x3c + 1);
              Duration::~Duration(&local_f8);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcdc9e:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bcdcb1;
      }
      iVar5 = 0;
    }
LAB_00bcdcb1:
    if (iVar5 != 0) goto LAB_00bcdcb5;
  }
  else {
LAB_00bcdcb5:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1282952;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1b0,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1bb,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1b0);
    pDVar1 = local_340;
    iVar5 = 0xc;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcde4f;
          iVar5 = 0xc;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::HoursToDuration(&local_120,local_310.field_0._impl_.seconds_ / 0x3c + -1);
              Duration::~Duration(&local_120);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcde4f:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bcde62;
      }
      iVar5 = 0;
    }
LAB_00bcde62:
    if (iVar5 != 0) goto LAB_00bcde66;
  }
  else {
LAB_00bcde66:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1bb,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_05);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1c8,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1be,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1c8);
    pDVar1 = local_340;
    iVar5 = 0xe;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bcdfc2;
          iVar5 = 0xe;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToNanoseconds(&local_2e8);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bcdfc2:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bcdfd5;
      }
      iVar5 = 0;
    }
LAB_00bcdfd5:
    if (iVar5 != 0) goto LAB_00bcdfd9;
  }
  else {
LAB_00bcdfd9:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1be,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_06);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1e0,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar4 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1e0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c0,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1e0);
    pDVar1 = local_340;
    bVar3 = true;
    if (bVar4) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce135;
          bVar3 = true;
          bVar4 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToNanoseconds(&local_310);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce135:
          bVar3 = false;
          bVar4 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar4) goto LAB_00bce148;
      }
      bVar3 = false;
    }
LAB_00bce148:
    if (bVar3) goto LAB_00bce14c;
  }
  else {
LAB_00bce14c:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c0,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_07);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_1f8,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c2,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1f8);
    pDVar1 = local_340;
    iVar5 = 0x12;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce2ab;
          iVar5 = 0x12;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToNanoseconds(&local_298);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce2ab:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bce2be;
      }
      iVar5 = 0;
    }
LAB_00bce2be:
    if (iVar5 != 0) goto LAB_00bce2c2;
  }
  else {
LAB_00bce2c2:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_08);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_210,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_210,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c4,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_210);
    pDVar1 = local_340;
    iVar5 = 0x14;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce421;
          iVar5 = 0x14;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToNanoseconds(&local_2c0);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce421:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bce434;
      }
      iVar5 = 0;
    }
LAB_00bce434:
    if (iVar5 != 0) goto LAB_00bce438;
  }
  else {
LAB_00bce438:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c4,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_09);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_228,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_228,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c6,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_228);
    pDVar1 = local_340;
    iVar5 = 0x16;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce594;
          iVar5 = 0x16;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToSeconds(&local_2e8);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce594:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bce5a7;
      }
      iVar5 = 0;
    }
LAB_00bce5a7:
    if (iVar5 != 0) goto LAB_00bce5ab;
  }
  else {
LAB_00bce5ab:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_10);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_240,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c8,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_240);
    pDVar1 = local_340;
    iVar5 = 0x18;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce707;
          iVar5 = 0x18;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToSeconds(&local_310);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce707:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bce71a;
      }
      iVar5 = 0;
    }
LAB_00bce71a:
    if (iVar5 != 0) goto LAB_00bce71e;
  }
  else {
LAB_00bce71e:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_11);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_258,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_258,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ca,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_258);
    pDVar1 = local_340;
    iVar5 = 0x1a;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*pDVar2->_vptr_DeathTest[4])(pDVar2,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce87d;
          iVar5 = 0x1a;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToSeconds(&local_298);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce87d:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bce890;
      }
      iVar5 = 0;
    }
LAB_00bce890:
    if (iVar5 != 0) goto LAB_00bce894;
  }
  else {
LAB_00bce894:
    testing::Message::Message((Message *)&local_330);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ca,pcVar6);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(((local_330.impl_.regex_.
                     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_338.data_ = (AssertHelperData *)0x1468032;
    testing::ContainsRegex<char_const*>(&local_330,(testing *)&local_338,regex_12);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_270,(PolymorphicMatcher *)&local_330);
    if (local_330.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_330.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_270,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1cc,&local_340);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_270);
    pDVar1 = local_340;
    iVar5 = 0x1c;
    if (bVar3) {
      if (local_340 != (DeathTest *)0x0) {
        iVar5 = (*local_340->_vptr_DeathTest[2])(local_340);
        pDVar2 = local_340;
        if (iVar5 == 0) {
          iVar5 = (*local_340->_vptr_DeathTest[3])(local_340);
          bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
          iVar5 = (*local_340->_vptr_DeathTest[4])(local_340,(ulong)bVar3);
          if ((char)iVar5 != '\0') goto LAB_00bce9f3;
          iVar5 = 0x1c;
          bVar3 = false;
        }
        else {
          if (iVar5 == 1) {
            bVar3 = testing::internal::AlwaysTrue();
            if (bVar3) {
              TimeUtil::DurationToSeconds(&local_2c0);
            }
            (*local_340->_vptr_DeathTest[5])(local_340,2);
            (*pDVar2->_vptr_DeathTest[5])(pDVar2,0);
          }
LAB_00bce9f3:
          iVar5 = 0;
          bVar3 = true;
        }
        (*pDVar1->_vptr_DeathTest[1])(pDVar1);
        if (!bVar3) goto LAB_00bcea06;
      }
      iVar5 = 0;
    }
LAB_00bcea06:
    if (iVar5 == 0) goto LAB_00bcea60;
  }
  testing::Message::Message((Message *)&local_330);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
             ,0x1cc,pcVar6);
  testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_330);
  testing::internal::AssertHelper::~AssertHelper(&local_338);
  if (local_330.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (**(code **)(((local_330.impl_.regex_.
                   super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->pattern_)._M_dataplus._M_p + 8))();
  }
LAB_00bcea60:
  Duration::~Duration(&local_2c0);
  Duration::~Duration(&local_298);
  Duration::~Duration(&local_310);
  Duration::~Duration(&local_2e8);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationBounds) {
  Duration overflow;
  overflow.set_seconds(TimeUtil::kDurationMaxSeconds + 1);
  Duration underflow;
  underflow.set_seconds(TimeUtil::kDurationMinSeconds - 1);
  Duration overflow_nanos;
  overflow_nanos.set_nanos(TimeUtil::kDurationMaxNanoseconds + 1);
  Duration underflow_nanos;
  underflow_nanos.set_nanos(TimeUtil::kDurationMinNanoseconds - 1);

  EXPECT_DEATH({ TimeUtil::SecondsToDuration(overflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH({ TimeUtil::SecondsToDuration(underflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); },
      "Duration hours");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); },
      "Duration hours");

  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow_nanos); },
                     "outside of the valid range");
}